

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFARecurseDeterminism
              (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,int fromnr,int tonr,xmlRegAtomPtr atom)

{
  int iVar1;
  int iVar2;
  xmlRegTrans *pxVar3;
  uint local_4c;
  int deep;
  xmlRegTransPtr t1;
  int nbTrans;
  int transnr;
  int res;
  int ret;
  xmlRegAtomPtr atom_local;
  int tonr_local;
  int fromnr_local;
  xmlRegStatePtr state_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  transnr = 1;
  if (state == (xmlRegStatePtr)0x0) {
    ctxt_local._4_4_ = 1;
  }
  else if (state->markd == XML_REGEXP_MARK_VISITED) {
    ctxt_local._4_4_ = 1;
  }
  else {
    local_4c = (uint)((ctxt->flags & 1U) == 0);
    iVar1 = state->nbTrans;
    for (t1._4_4_ = 0; t1._4_4_ < iVar1; t1._4_4_ = t1._4_4_ + 1) {
      pxVar3 = state->trans + t1._4_4_;
      if ((-1 < pxVar3->to) && (pxVar3->to != fromnr)) {
        if (pxVar3->atom == (xmlRegAtomPtr)0x0) {
          state->markd = XML_REGEXP_MARK_VISITED;
          iVar2 = xmlFARecurseDeterminism(ctxt,ctxt->states[pxVar3->to],fromnr,tonr,atom);
          if (iVar2 == 0) {
            transnr = 0;
          }
        }
        else {
          iVar2 = xmlFACompareAtoms(pxVar3->atom,atom,local_4c);
          if (iVar2 != 0) {
            if ((pxVar3->to != tonr) ||
               (iVar2 = xmlFAEqualAtoms(pxVar3->atom,atom,local_4c), iVar2 == 0)) {
              transnr = 0;
            }
            pxVar3->nd = 1;
          }
        }
      }
    }
    ctxt_local._4_4_ = transnr;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlFARecurseDeterminism(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	                int fromnr, int tonr, xmlRegAtomPtr atom) {
    int ret = 1;
    int res;
    int transnr, nbTrans;
    xmlRegTransPtr t1;
    int deep = 1;

    if (state == NULL)
	return(ret);
    if (state->markd == XML_REGEXP_MARK_VISITED)
	return(ret);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * don't recurse on transitions potentially added in the course of
     * the elimination.
     */
    nbTrans = state->nbTrans;
    for (transnr = 0;transnr < nbTrans;transnr++) {
	t1 = &(state->trans[transnr]);
	/*
	 * check transitions conflicting with the one looked at
	 */
        if ((t1->to < 0) || (t1->to == fromnr))
            continue;
	if (t1->atom == NULL) {
	    state->markd = XML_REGEXP_MARK_VISITED;
	    res = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
		                          fromnr, tonr, atom);
	    if (res == 0) {
	        ret = 0;
		/* t1->nd = 1; */
	    }
	    continue;
	}
	if (xmlFACompareAtoms(t1->atom, atom, deep)) {
            /* Treat equal transitions as deterministic. */
            if ((t1->to != tonr) ||
                (!xmlFAEqualAtoms(t1->atom, atom, deep)))
                ret = 0;
	    /* mark the transition as non-deterministic */
	    t1->nd = 1;
	}
    }
    return(ret);
}